

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::getRoundedTessLevel(SpacingMode mode,float clampedTessLevel)

{
  float fVar1;
  int local_14;
  int result;
  float clampedTessLevel_local;
  SpacingMode mode_local;
  
  fVar1 = deFloatCeil(clampedTessLevel);
  local_14 = (int)fVar1;
  if (mode != SPACINGMODE_EQUAL) {
    if (mode == SPACINGMODE_FRACTIONAL_ODD) {
      local_14 = (1 - local_14 % 2) + local_14;
    }
    else if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
      local_14 = local_14 % 2 + local_14;
    }
  }
  return local_14;
}

Assistant:

int getRoundedTessLevel (const SpacingMode mode, const float clampedTessLevel)
{
	static const int minimumMaxTessGenLevel = 64;	//!< Minimum maxTessellationGenerationLevel defined by the spec.

	int result = (int)deFloatCeil(clampedTessLevel);

	switch (mode)
	{
		case SPACINGMODE_EQUAL:											break;
		case SPACINGMODE_FRACTIONAL_ODD:	result += 1 - result % 2;	break;
		case SPACINGMODE_FRACTIONAL_EVEN:	result += result % 2;		break;
		default:
			DE_ASSERT(false);
	}
	DE_ASSERT(de::inRange<int>(result, 1, minimumMaxTessGenLevel));
	DE_UNREF(minimumMaxTessGenLevel);

	return result;
}